

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt2pbf.cpp
# Opt level: O3

void pbrt::semantic::usage(string *msg)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  long *plVar4;
  
  iVar2 = std::__cxx11::string::compare((char *)msg);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error: ",7);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(msg->_M_dataplus)._M_p,msg->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    plVar4 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"./pbrt2pbf inFile.pbrt|inFile.pbf <args>");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar3 = std::operator<<((ostream *)&std::cout,"  -o <out.pbf>   : where to write the output to");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "                   (tris to quads, removing reundant fields, etc)");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  bVar1 = std::operator==(msg,"");
  exit((uint)!bVar1);
}

Assistant:

void usage(const std::string &msg)
    {
      if (msg != "") std::cerr << "Error: " << msg << std::endl << std::endl;
      std::cout << "./pbrt2pbf inFile.pbrt|inFile.pbf <args>" << std::endl;
      std::cout << std::endl;
      std::cout << "  -o <out.pbf>   : where to write the output to" << std::endl;
      std::cout << "                   (tris to quads, removing reundant fields, etc)" << std::endl;
      std::cout << std::endl;
      exit(msg == "" ? 0 : 1);
    }